

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse41.c
# Opt level: O2

void VP8LDspInitSSE41(void)

{
  return;
}

Assistant:

WEBP_TSAN_IGNORE_FUNCTION void VP8LDspInitSSE41(void) {
  VP8LTransformColorInverse = TransformColorInverse_SSE41;
  VP8LConvertBGRAToRGB = ConvertBGRAToRGB_SSE41;
  VP8LConvertBGRAToBGR = ConvertBGRAToBGR_SSE41;

  // SSE exports for AVX and above.
  VP8LTransformColorInverse_SSE = TransformColorInverse_SSE41;
  VP8LConvertBGRAToRGB_SSE = ConvertBGRAToRGB_SSE41;
}